

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeIncStackPos(AsyncifyBuilder *this,int32_t by)

{
  Type *this_00;
  BinaryOp BVar1;
  uintptr_t uVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  uintptr_t uVar6;
  uint uVar7;
  uint uVar8;
  Expression *pEVar9;
  Expression *pEVar10;
  Const *pCVar11;
  Binary *this_01;
  Store *this_02;
  undefined1 local_70 [8];
  Literal literal;
  
  if (by == 0) {
    this_02 = (Store *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x10,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = NopId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
  }
  else {
    this_00 = &this->pointerType;
    Literal::makeFromInt64((Literal *)local_70,(long)by,(Type)(this->pointerType).id);
    uVar7 = wasm::Type::getByteSize(this_00);
    uVar8 = wasm::Type::getByteSize(this_00);
    uVar6 = DAT_010b1928;
    uVar5 = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
    uVar2 = (this->pointerType).id;
    pEVar9 = (Expression *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x20,8);
    pEVar9->_id = GlobalGetId;
    *(undefined8 *)(pEVar9 + 1) = uVar5;
    pEVar9[1].type.id = uVar6;
    (pEVar9->type).id = uVar2;
    if (6 < this_00->id) {
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    BVar1 = *(BinaryOp *)(&DAT_00dc82e8 + this_00->id * 4);
    pEVar10 = makeGetStackPos(this);
    Literal::Literal((Literal *)&literal.type,(Literal *)local_70);
    pCVar11 = Builder::makeConst(&this->super_Builder,(Literal *)&literal.type);
    this_01 = (Binary *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar1;
    this_01->left = pEVar10;
    this_01->right = (Expression *)pCVar11;
    Binary::finalize(this_01);
    uVar2 = (this->pointerType).id;
    sVar3 = (this->asyncifyMemory).super_IString.str._M_len;
    pcVar4 = (this->asyncifyMemory).super_IString.str._M_str;
    this_02 = (Store *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x58,8);
    *(undefined8 *)&(this_02->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&this_02->bytes = 0;
    (this_02->offset).addr = 0;
    (this_02->align).addr = 0;
    *(undefined8 *)&this_02->isAtomic = 0;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    this_02->bytes = (uint8_t)uVar7;
    (this_02->align).addr = (ulong)uVar8;
    this_02->ptr = pEVar9;
    this_02->value = (Expression *)this_01;
    (this_02->valueType).id = uVar2;
    (this_02->memory).super_IString.str._M_len = sVar3;
    (this_02->memory).super_IString.str._M_str = pcVar4;
    Store::finalize(this_02);
    Literal::~Literal((Literal *)&literal.type);
    Literal::~Literal((Literal *)local_70);
  }
  return (Expression *)this_02;
}

Assistant:

Expression* makeIncStackPos(int32_t by) {
    if (by == 0) {
      return makeNop();
    }
    auto literal = Literal::makeFromInt64(by, pointerType);
    return makeStore(pointerType.getByteSize(),
                     int(DataOffset::BStackPos),
                     pointerType.getByteSize(),
                     makeGlobalGet(ASYNCIFY_DATA, pointerType),
                     makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                                makeGetStackPos(),
                                makeConst(literal)),
                     pointerType,
                     asyncifyMemory);
  }